

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NamedArgumentSyntax::setChild
          (NamedArgumentSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 uVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  logic_error *this_00;
  Token TVar4;
  long lStack_f0;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (index < 5) {
    switch(index) {
    case 0:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      pIVar3 = TVar4.info;
      uVar1 = TVar4._0_8_;
      (this->dot).kind = (short)uVar1;
      (this->dot).field_0x2 = (char)((ulong)uVar1 >> 0x10);
      (this->dot).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
      (this->dot).rawLen = (int)((ulong)uVar1 >> 0x20);
      lStack_f0 = 0x18;
      break;
    case 1:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      pIVar3 = TVar4.info;
      uVar1 = TVar4._0_8_;
      (this->name).kind = (short)uVar1;
      (this->name).field_0x2 = (char)((ulong)uVar1 >> 0x10);
      (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
      (this->name).rawLen = (int)((ulong)uVar1 >> 0x20);
      lStack_f0 = 0x28;
      break;
    case 2:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      pIVar3 = TVar4.info;
      uVar1 = TVar4._0_8_;
      (this->openParen).kind = (short)uVar1;
      (this->openParen).field_0x2 = (char)((ulong)uVar1 >> 0x10);
      (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
      (this->openParen).rawLen = (int)((ulong)uVar1 >> 0x20);
      lStack_f0 = 0x38;
      break;
    case 3:
      pSVar2 = TokenOrSyntax::node(&child);
      lStack_f0 = 0x40;
      if (pSVar2 == (SyntaxNode *)0x0) {
        pIVar3 = (Info *)0x0;
      }
      else {
        pSVar2 = TokenOrSyntax::node(&child);
        pIVar3 = (Info *)SyntaxNode::as<slang::syntax::PropertyExprSyntax>(pSVar2);
      }
      break;
    case 4:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      pIVar3 = TVar4.info;
      uVar1 = TVar4._0_8_;
      (this->closeParen).kind = (short)uVar1;
      (this->closeParen).field_0x2 = (char)((ulong)uVar1 >> 0x10);
      (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
      (this->closeParen).rawLen = (int)((ulong)uVar1 >> 0x20);
      lStack_f0 = 0x50;
    }
    *(Info **)((long)&(this->super_ArgumentSyntax).super_SyntaxNode.parent + lStack_f0) = pIVar3;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_e1);
  std::operator+(&local_a0,&local_c0,":");
  std::__cxx11::to_string(&local_e0,0x21bc);
  std::operator+(&local_80,&local_a0,&local_e0);
  std::operator+(&local_60,&local_80,": ");
  std::operator+(&local_40,&local_60,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void NamedArgumentSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dot = child.token(); return;
        case 1: name = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        case 4: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}